

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O2

bool __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
do_push<true>(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this
             ,Task **t)

{
  tagged_index tVar1;
  bool bVar2;
  long lVar3;
  tagged_index *this_00;
  tagged_node_handle tail;
  tagged_node_handle next;
  unsigned_short local_42;
  ulong local_40;
  node *local_38;
  
  local_42 = (unsigned_short)
             (this->pool).
             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
             .node_count_;
  local_38 = detail::
             fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
             ::construct<true,true,depspawn::internal::TaskPool::Task*,unsigned_short>
                       ((fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
                         *)&this->pool,t,&local_42);
  if (local_38 != (node *)0x0) {
    local_40 = (ulong)((uint)((int)local_38 -
                             *(int *)&(this->pool).
                                      super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                                      .nodes_) >> 6 & 0xffff);
    do {
      while( true ) {
        do {
          tail = (this->tail_)._M_i;
          this_00 = (tagged_index *)
                    ((long)&(((this->pool).
                              super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                             .nodes_)->next)._M_i.index + (ulong)(((uint)tail & 0xffff) << 6));
          if (tail.index ==
              (index_t)(this->pool).
                       super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                       .node_count_) {
            this_00 = (tagged_index *)0x0;
          }
          next.index = this_00->index;
          next.tag = this_00->tag;
          lVar3 = 0;
          if (next.index !=
              (index_t)(this->pool).
                       super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                       .node_count_) {
            lVar3 = (long)&(((this->pool).
                             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                            .nodes_)->next)._M_i.index + (ulong)(((uint)next & 0xffff) << 6);
          }
          tVar1 = (this->tail_)._M_i;
        } while ((tail.index != tVar1.index) || (tail.tag != tVar1.tag));
        if (lVar3 == 0) break;
        std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
                  (&this->tail_,&tail,
                   (tagged_index)
                   (((uint)tVar1 & 0xffff0000) +
                    ((uint)((int)lVar3 -
                           *(int *)&(this->pool).
                                    super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                                    .nodes_) >> 6 & 0xffff) + 0x10000),memory_order_seq_cst);
      }
      bVar2 = std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_weak
                        ((atomic<boost::lockfree::detail::tagged_index> *)this_00,&next,
                         (tagged_index)(((uint)next & 0xffff0000) + (int)local_40 + 0x10000),
                         memory_order_seq_cst);
    } while (!bVar2);
    std::atomic<boost::lockfree::detail::tagged_index>::compare_exchange_strong
              (&this->tail_,&tail,
               (tagged_index)(((uint)tail & 0xffff0000) + (int)local_40 + 0x10000),
               memory_order_seq_cst);
  }
  return local_38 != (node *)0x0;
}

Assistant:

bool do_push(T const & t)
    {
        node * n = pool.template construct<true, Bounded>(t, pool.null_handle());
        handle_type node_handle = pool.get_handle(n);

        if (n == NULL)
            return false;

        for (;;) {
            tagged_node_handle tail = tail_.load(memory_order_acquire);
            node * tail_node = pool.get_pointer(tail);
            tagged_node_handle next = tail_node->next.load(memory_order_acquire);
            node * next_ptr = pool.get_pointer(next);

            tagged_node_handle tail2 = tail_.load(memory_order_acquire);
            if (BOOST_LIKELY(tail == tail2)) {
                if (next_ptr == 0) {
                    tagged_node_handle new_tail_next(node_handle, next.get_next_tag());
                    if ( tail_node->next.compare_exchange_weak(next, new_tail_next) ) {
                        tagged_node_handle new_tail(node_handle, tail.get_next_tag());
                        tail_.compare_exchange_strong(tail, new_tail);
                        return true;
                    }
                }
                else {
                    tagged_node_handle new_tail(pool.get_handle(next_ptr), tail.get_next_tag());
                    tail_.compare_exchange_strong(tail, new_tail);
                }
            }
        }
    }